

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v5::internal::sprintf_format<double>(double value,buffer *buf,core_format_specs spec)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char format [10];
  char local_42 [10];
  double local_38;
  
  local_42[0] = '%';
  if (((ulong)spec >> 0x23 & 1) == 0) {
    pcVar4 = local_42 + 1;
  }
  else {
    pcVar4 = local_42 + 2;
    local_42[1] = 0x23;
  }
  if (-1 < spec.precision) {
    pcVar4[0] = '.';
    pcVar4[1] = '*';
    pcVar4 = pcVar4 + 2;
  }
  *pcVar4 = spec.type;
  pcVar4[1] = '\0';
  local_38 = value;
  do {
    uVar3 = char_traits<char>::format_float<double>
                      (buf->ptr_,buf->capacity_,local_42,spec.precision,local_38);
    if ((int)uVar3 < 0) {
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_basic_buffer)(buf,buf->capacity_ + 1);
      }
LAB_001490f5:
      bVar2 = false;
    }
    else {
      uVar5 = (ulong)uVar3;
      uVar1 = buf->capacity_;
      if (uVar5 < uVar1) {
        buf->size_ = uVar5;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        if (uVar1 < uVar3 + 1) {
          (**buf->_vptr_basic_buffer)(buf,(ulong)(uVar3 + 1));
        }
      }
      if (uVar1 <= uVar5) goto LAB_001490f5;
    }
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void sprintf_format(Double value, internal::buffer &buf,
                    core_format_specs spec) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() != 0, "empty buffer");

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  char format[MAX_FORMAT_SIZE];
  char *format_ptr = format;
  *format_ptr++ = '%';
  if (spec.has(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<Double, long double>::value)
    *format_ptr++ = 'L';
  *format_ptr++ = spec.type;
  *format_ptr = '\0';

  // Format using snprintf.
  char *start = FMT_NULL;
  for (;;) {
    std::size_t buffer_size = buf.capacity();
    start = &buf[0];
    int result = internal::char_traits<char>::format_float(
        start, buffer_size, format, spec.precision, value);
    if (result >= 0) {
      unsigned n = internal::to_unsigned(result);
      if (n < buf.capacity()) {
        buf.resize(n);
        break;  // The buffer is large enough - continue with formatting.
      }
      buf.reserve(n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buf.reserve(buf.capacity() + 1);
    }
  }
}